

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

void __thiscall Potassco::AspifTextOutput::visitTheories(AspifTextOutput *this)

{
  TheoryData *this_00;
  atom_iterator ppTVar1;
  atom_iterator ppTVar2;
  ostream *poVar3;
  uint atom;
  string name;
  BuildStr toStr;
  
  toStr.super_TheoryAtomStringBuilder.res_._M_dataplus._M_p =
       (pointer)&toStr.super_TheoryAtomStringBuilder.res_.field_2;
  toStr.super_TheoryAtomStringBuilder.res_._M_string_length = 0;
  toStr.super_TheoryAtomStringBuilder.res_.field_2._M_local_buf[0] = '\0';
  toStr.super_TheoryAtomStringBuilder._vptr_TheoryAtomStringBuilder =
       (_func_int **)&PTR_getCondition_0012b428;
  this_00 = &this->theory_;
  toStr.self = this;
  ppTVar1 = TheoryData::currBegin(this_00);
  ppTVar2 = TheoryData::end(this_00);
  if (ppTVar1 != ppTVar2) {
    do {
      atom = *(uint *)*ppTVar1 & 0x7fffffff;
      TheoryAtomStringBuilder::toString_abi_cxx11_
                (&name,&toStr.super_TheoryAtomStringBuilder,this_00,*ppTVar1);
      if (atom == 0) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (this->os_,name._M_dataplus._M_p,name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
      }
      else {
        if (atom <= this->maxAtom_) {
          fail(-2,"void Potassco::AspifTextOutput::visitTheories()",0x2be,"atom > maxAtom_",
               "Redefinition: theory atom \'%u:%s\' already defined in a previous step",(ulong)atom,
               name._M_dataplus._M_p,0);
        }
        assignAtomName(this,atom,&name);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
      ppTVar1 = ppTVar1 + 1;
    } while (ppTVar1 != ppTVar2);
  }
  toStr.super_TheoryAtomStringBuilder._vptr_TheoryAtomStringBuilder =
       (_func_int **)&PTR___cxa_pure_virtual_0012b4a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)toStr.super_TheoryAtomStringBuilder.res_._M_dataplus._M_p !=
      &toStr.super_TheoryAtomStringBuilder.res_.field_2) {
    operator_delete(toStr.super_TheoryAtomStringBuilder.res_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AspifTextOutput::visitTheories() {
	struct BuildStr : public TheoryAtomStringBuilder {
		explicit BuildStr(AspifTextOutput& s) : self(&s) {}
		virtual LitSpan getCondition(Id_t condId) const {
			return self->data_->getCondition(condId);
		}
		virtual std::string getName(Atom_t id) const {
			if (const std::string* name = self->data_->getAtomName(id)) {
				return *name;
			}
			return std::string("x_").append(Potassco::toString(id));
		}
		AspifTextOutput* self;
	} toStr(*this);
	for (TheoryData::atom_iterator it = theory_.currBegin(), end = theory_.end(); it != end; ++it) {
		Atom_t atom = (*it)->atom();
		std::string name = toStr.toString(theory_, **it);
		if (!atom) {
			os_ << name << ".\n";
		}
		else {
			POTASSCO_REQUIRE(atom > maxAtom_, "Redefinition: theory atom '%u:%s' already defined in a previous step", atom, name.c_str());
			assignAtomName(atom, name);
		}
	}
}